

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*>
slang::ast::getDirAndType(Symbol *port)

{
  Type *pTVar1;
  PortSymbol *ps;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> pVar2;
  
  if (port->kind == Port) {
    pTVar1 = PortSymbol::getType((PortSymbol *)port);
  }
  else {
    pTVar1 = MultiPortSymbol::getType((MultiPortSymbol *)port);
  }
  pVar2._4_4_ = 0;
  pVar2.first = *(uint *)&port[1].name._M_str;
  pVar2.second = pTVar1;
  return pVar2;
}

Assistant:

static std::pair<ArgumentDirection, const Type*> getDirAndType(const Symbol& port) {
    if (port.kind == SymbolKind::Port) {
        auto& ps = port.as<PortSymbol>();
        return {ps.direction, &ps.getType()};
    }
    else {
        auto& mp = port.as<MultiPortSymbol>();
        return {mp.direction, &mp.getType()};
    }
}